

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_test.c
# Opt level: O0

bool_t zzTest(void)

{
  bool_t bVar1;
  bool bVar2;
  
  bVar1 = zzTestAdd();
  bVar2 = false;
  if (bVar1 != 0) {
    bVar1 = zzTestMul();
    bVar2 = false;
    if (bVar1 != 0) {
      bVar1 = zzTestMod();
      bVar2 = false;
      if (bVar1 != 0) {
        bVar1 = zzTestGCD();
        bVar2 = false;
        if (bVar1 != 0) {
          bVar1 = zzTestRed();
          bVar2 = false;
          if (bVar1 != 0) {
            bVar1 = zzTestEtc();
            bVar2 = bVar1 != 0;
          }
        }
      }
    }
  }
  return (bool_t)bVar2;
}

Assistant:

bool_t zzTest()
{
	return zzTestAdd() && 
		zzTestMul() && 
		zzTestMod() && 
		zzTestGCD() && 
		zzTestRed() &&
		zzTestEtc();
}